

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QThemeIconInfo * __thiscall
QIconLoader::findIconHelper
          (QThemeIconInfo *__return_storage_ptr__,QIconLoader *this,QString *themeName,
          QString *iconName,QStringList *visited,DashRule rule)

{
  QIconTheme *this_00;
  char **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  QSharedPointer<QIconCacheGtkReader> *pQVar4;
  QIconCacheGtkReader *this_01;
  Data *dd;
  QArrayData *pQVar5;
  QIconDirInfo *pQVar6;
  qsizetype qVar7;
  QStringView name;
  QStringView QVar8;
  Data *pDVar9;
  int *piVar10;
  QString *pQVar11;
  Data *this_02;
  Data *pDVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Data *pDVar15;
  QIconDirInfo *pQVar16;
  char cVar17;
  int iVar18;
  storage_type *psVar19;
  QArrayDataPointer<QIconDirInfo> *pQVar20;
  pointer puVar21;
  long lVar22;
  pointer puVar23;
  char *pcVar24;
  char16_t *pcVar25;
  storage_type *psVar26;
  QIconDirInfo *args;
  char **ppcVar27;
  ulong uVar28;
  long lVar29;
  char *pcVar30;
  long in_FS_OFFSET;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QThemeIconInfo *info;
  QDebug local_1c0;
  QDebug local_1b8;
  QtPrivate local_1b0 [8];
  QStringBuilder<const_QString_&,_const_QString_&> local_1a8;
  QString local_198;
  QList<const_char_*> local_178;
  QArrayDataPointer<QIconDirInfo> local_158;
  QArrayData local_140;
  QArrayDataPointer<QString> local_130;
  QDebug local_118;
  QtPrivate local_110 [8];
  QArrayDataPointer<QIconDirInfo> local_108;
  undefined1 local_e8 [32];
  QArrayDataPointer<QIconDirInfo> local_c8;
  QIconTheme local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_a8.m_contentDirs.d.d._0_4_ = 2;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
    QMessageLogger::debug();
    pDVar9 = local_130.d;
    QVar31.m_data = &DAT_0000000c;
    QVar31.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar31);
    QTextStream::operator<<((QTextStream *)pDVar9,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_130.d,' ');
    }
    pcVar25 = (iconName->d).ptr;
    if (pcVar25 == (char16_t *)0x0) {
      pcVar25 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_130,(ulong)pcVar25);
    if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_130.d,' ');
    }
    pDVar9 = local_130.d;
    QVar32.m_data = &DAT_00000008;
    QVar32.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar32);
    QTextStream::operator<<((QTextStream *)pDVar9,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_130.d,' ');
    }
    pcVar25 = (themeName->d).ptr;
    if (pcVar25 == (char16_t *)0x0) {
      pcVar25 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_130,(ulong)pcVar25);
    if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_130.d,' ');
    }
    pDVar9 = local_130.d;
    QVar33.m_data = &DAT_00000008;
    QVar33.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar33);
    QTextStream::operator<<((QTextStream *)pDVar9,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_130.d,' ');
    }
    *(int *)&local_130.d[2].super_QArrayData.alloc = (int)local_130.d[2].super_QArrayData.alloc + 1;
    local_118.stream = (Stream *)0x0;
    local_108.d = (Data *)local_130.d;
    QtPrivate::printSequentialContainer<QList<QString>>
              (local_110,(Stream *)&local_108,"QList",visited);
    QDebug::~QDebug((QDebug *)&local_108);
    QDebug::~QDebug((QDebug *)local_110);
    QDebug::~QDebug(&local_118);
    QDebug::~QDebug((QDebug *)&local_130);
  }
  (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->iconName).d.size = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)visited,(visited->d).size,themeName);
  QList<QString>::end(visited);
  QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
  ::try_emplace<>((pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
                   *)&local_a8,&this->themeList,themeName);
  lVar22 = CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_) * 0x68;
  lVar29 = *(long *)(CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_) +
                    0xa0);
  this_00 = (QIconTheme *)(lVar29 + lVar22);
  if (*(char *)(lVar29 + 0x48 + lVar22) == '\0') {
    QIconTheme::QIconTheme(&local_a8,themeName);
    pDVar9 = (Data *)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    pQVar11 = (QString *)
              CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_);
    local_a8.m_contentDirs.d.d._0_4_ = 0;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    qVar7 = CONCAT44(local_a8.m_contentDirs.d.size._4_4_,(undefined4)local_a8.m_contentDirs.d.size);
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    local_108.d = (Data *)(this_00->m_contentDirs).d.d;
    (this_00->m_contentDirs).d.d = pDVar9;
    local_108.ptr = (QIconDirInfo *)(this_00->m_contentDirs).d.ptr;
    (this_00->m_contentDirs).d.ptr = pQVar11;
    local_108.size = (this_00->m_contentDirs).d.size;
    (this_00->m_contentDirs).d.size = qVar7;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_108);
    qVar7 = local_a8.m_keyList.d.size;
    pQVar6 = local_a8.m_keyList.d.ptr;
    pDVar12 = local_a8.m_keyList.d.d;
    local_a8.m_keyList.d.d = (Data *)0x0;
    local_a8.m_keyList.d.ptr = (QIconDirInfo *)0x0;
    local_a8.m_keyList.d.size = 0;
    local_108.d = (this_00->m_keyList).d.d;
    (this_00->m_keyList).d.d = pDVar12;
    local_108.ptr = (this_00->m_keyList).d.ptr;
    (this_00->m_keyList).d.ptr = pQVar6;
    local_108.size = (this_00->m_keyList).d.size;
    (this_00->m_keyList).d.size = qVar7;
    QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_108);
    qVar7 = local_a8.m_parents.d.size;
    pQVar11 = local_a8.m_parents.d.ptr;
    pDVar9 = local_a8.m_parents.d.d;
    local_a8.m_parents.d.d = (Data *)0x0;
    local_a8.m_parents.d.ptr = (QString *)0x0;
    local_a8.m_parents.d.size = 0;
    local_108.d = (Data *)(this_00->m_parents).d.d;
    (this_00->m_parents).d.d = pDVar9;
    local_108.ptr = (QIconDirInfo *)(this_00->m_parents).d.ptr;
    (this_00->m_parents).d.ptr = pQVar11;
    local_108.size = (this_00->m_parents).d.size;
    (this_00->m_parents).d.size = qVar7;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_108);
    qVar7 = local_a8.m_gtkCaches.d.size;
    pQVar4 = local_a8.m_gtkCaches.d.ptr;
    pDVar15 = local_a8.m_gtkCaches.d.d;
    this_00->m_valid = local_a8.m_valid;
    local_a8.m_gtkCaches.d.d = (Data *)0x0;
    local_a8.m_gtkCaches.d.ptr = (QSharedPointer<QIconCacheGtkReader> *)0x0;
    local_a8.m_gtkCaches.d.size = 0;
    local_108.d = (Data *)(this_00->m_gtkCaches).d.d;
    (this_00->m_gtkCaches).d.d = pDVar15;
    local_108.ptr = (QIconDirInfo *)(this_00->m_gtkCaches).d.ptr;
    (this_00->m_gtkCaches).d.ptr = pQVar4;
    local_108.size = (this_00->m_gtkCaches).d.size;
    (this_00->m_gtkCaches).d.size = qVar7;
    QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_>::~QArrayDataPointer
              ((QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_> *)&local_108);
    QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_>::~QArrayDataPointer
              (&local_a8.m_gtkCaches.d);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8.m_parents.d);
    QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_a8.m_keyList.d);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
    if (this_00->m_valid == false) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_a8.m_contentDirs.d.d._0_4_ = 2;
        local_a8.m_contentDirs.d.d._4_4_ = 0;
        local_a8.m_contentDirs.d.ptr._0_4_ = 0;
        local_a8.m_contentDirs.d.ptr._4_4_ = 0;
        local_a8.m_contentDirs.d.size._0_4_ = 0;
        local_a8.m_contentDirs.d.size._4_4_ = 0;
        local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
        QMessageLogger::debug();
        pDVar9 = local_130.d;
        QVar47.m_data = &DAT_00000005;
        QVar47.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar47);
        QTextStream::operator<<((QTextStream *)pDVar9,(QString *)&local_108);
        if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_130.d,' ');
        }
        pcVar25 = (themeName->d).ptr;
        if (pcVar25 == (char16_t *)0x0) {
          pcVar25 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_130,(ulong)pcVar25);
        if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_130.d,' ');
        }
        pDVar9 = local_130.d;
        QVar48.m_data = (storage_type *)0x9;
        QVar48.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar48);
        QTextStream::operator<<((QTextStream *)pDVar9,(QString *)&local_108);
        if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_130.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_130.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_130);
      }
      goto LAB_0027adf3;
    }
  }
  local_130.d = (this_00->m_contentDirs).d.d;
  local_130.ptr = (this_00->m_contentDirs).d.ptr;
  local_130.size = (this_00->m_contentDirs).d.size;
  if (&(local_130.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_130.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_130.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_140.alloc = (qsizetype)(iconName->d).ptr;
  uVar2 = (iconName->d).size;
  puVar21 = (__return_storage_ptr__->entries).
            super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (__return_storage_ptr__->entries).
            super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_140._0_8_ = uVar2;
  if (puVar21 == puVar23) {
    uVar3 = (this->m_iconName).d.size;
    local_a8.m_contentDirs.d.size._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.size._4_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.d._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.d._4_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0xaaaaaaaa;
    local_108.ptr = (QIconDirInfo *)0x4;
    local_108.size = 0x675b0e;
    local_108.d = (Data *)&local_140;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_a8,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_108);
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_158.ptr = (QIconDirInfo *)0x4;
    local_158.size = 0x6af886;
    local_158.d = (Data *)&local_140;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_158);
    if (local_130.size != 0) {
      uVar28 = 0;
      do {
        local_158.d = (this_00->m_keyList).d.d;
        local_158.ptr = (this_00->m_keyList).d.ptr;
        local_158.size = (this_00->m_keyList).d.size;
        if (&(local_158.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((local_158.d)->super_QArrayData).ref_)->d =
               *(int *)&((DataPointer *)&((local_158.d)->super_QArrayData).ref_)->d + 1;
          UNLOCK();
        }
        pQVar4 = (this_00->m_gtkCaches).d.ptr;
        this_01 = pQVar4[uVar28].value.ptr;
        dd = pQVar4[uVar28].d;
        if (dd != (Data *)0x0) {
          LOCK();
          (dd->weakref)._q_value.super___atomic_base<int>._M_i =
               (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (dd->strongref)._q_value.super___atomic_base<int>._M_i =
               (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (this_01->m_isValid == true) {
          local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_178.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
          name.m_data = (storage_type_conflict *)local_140.alloc;
          name.m_size._0_4_ = local_140.ref_._q_value.super___atomic_base<int>._M_i;
          name.m_size._4_4_ =
               local_140.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i;
          QIconCacheGtkReader::lookup(&local_178,this_01,name);
          if (this_01->m_isValid == true) {
            local_c8.d = local_158.d;
            local_c8.ptr = local_158.ptr;
            local_c8.size = local_158.size;
            if (&(local_158.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&(local_158.d)->super_QArrayData)->d =
                   *(int *)&((DataPointer *)&(local_158.d)->super_QArrayData)->d + 1;
              UNLOCK();
            }
            QList<QIconDirInfo>::clear((QList<QIconDirInfo> *)&local_158);
            QList<QIconDirInfo>::reserve((QList<QIconDirInfo> *)&local_158,local_178.d.size);
            if ((undefined1 *)local_178.d.size != (undefined1 *)0x0) {
              ppcVar1 = local_178.d.ptr + local_178.d.size;
              ppcVar27 = local_178.d.ptr;
              do {
                local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                if (*ppcVar27 == (char *)0x0) {
                  psVar26 = (storage_type *)0x0;
                }
                else {
                  psVar19 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar26 = psVar19 + 1;
                    pcVar30 = *ppcVar27 + 1 + (long)psVar19;
                    psVar19 = psVar26;
                  } while (*pcVar30 != '\0');
                }
                QVar34.m_data = psVar26;
                QVar34.m_size = (qsizetype)local_e8;
                QString::fromUtf8(QVar34);
                qVar7 = local_c8.size;
                pQVar6 = local_c8.ptr;
                uVar14 = local_e8._16_8_;
                uVar13 = local_e8._8_8_;
                args = local_c8.ptr;
                pcVar30 = (char *)local_c8.size;
                if (0 < local_c8.size >> 2) {
                  lVar22 = (local_c8.size >> 2) + 1;
                  lVar29 = local_c8.size * 0x28;
                  pQVar16 = local_c8.ptr + 2;
                  do {
                    args = pQVar16;
                    if (((undefined1 *)args[-2].path.d.size == (undefined1 *)uVar14) &&
                       (QVar35.m_data = args[-2].path.d.ptr, QVar35.m_size = uVar14,
                       QVar50.m_data = (storage_type_conflict *)uVar13, QVar50.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar35,QVar50), cVar17 != '\0')) {
                      args = args + -2;
                      goto LAB_0027a164;
                    }
                    if (((undefined1 *)args[-1].path.d.size == (undefined1 *)uVar14) &&
                       (QVar36.m_data = args[-1].path.d.ptr, QVar36.m_size = uVar14,
                       QVar51.m_data = (storage_type_conflict *)uVar13, QVar51.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar36,QVar51), cVar17 != '\0')) {
                      args = args + -1;
                      goto LAB_0027a164;
                    }
                    if (((undefined1 *)(args->path).d.size == (undefined1 *)uVar14) &&
                       (QVar37.m_data = (args->path).d.ptr, QVar37.m_size = uVar14,
                       QVar52.m_data = (storage_type_conflict *)uVar13, QVar52.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar37,QVar52), cVar17 != '\0'))
                    goto LAB_0027a164;
                    if (((undefined1 *)args[1].path.d.size == (undefined1 *)uVar14) &&
                       (QVar38.m_data = args[1].path.d.ptr, QVar38.m_size = uVar14,
                       QVar53.m_data = (storage_type_conflict *)uVar13, QVar53.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar38,QVar53), cVar17 != '\0')) {
                      args = args + 1;
                      goto LAB_0027a164;
                    }
                    lVar22 = lVar22 + -1;
                    lVar29 = lVar29 + -0xa0;
                    pQVar16 = args + 4;
                  } while (1 < lVar22);
                  pcVar30 = (char *)((lVar29 >> 3) * -0x3333333333333333);
                  args = args + 2;
                }
                if (pcVar30 == (char *)0x1) {
LAB_0027a11f:
                  if (((undefined1 *)(args->path).d.size == (undefined1 *)uVar14) &&
                     (QVar41.m_data = (args->path).d.ptr, QVar41.m_size = uVar14,
                     QVar56.m_data = (storage_type_conflict *)uVar13, QVar56.m_size = uVar14,
                     cVar17 = QtPrivate::equalStrings(QVar41,QVar56), cVar17 != '\0'))
                  goto LAB_0027a164;
                }
                else {
                  if (pcVar30 == (char *)0x2) {
LAB_0027a0f0:
                    if (((undefined1 *)(args->path).d.size != (undefined1 *)uVar14) ||
                       (QVar40.m_data = (args->path).d.ptr, QVar40.m_size = uVar14,
                       QVar55.m_data = (storage_type_conflict *)uVar13, QVar55.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar40,QVar55), cVar17 == '\0')) {
                      args = args + 1;
                      goto LAB_0027a11f;
                    }
                  }
                  else {
                    if (pcVar30 != (char *)0x3) goto LAB_0027a19b;
                    if (((undefined1 *)(args->path).d.size != (undefined1 *)uVar14) ||
                       (QVar39.m_data = (args->path).d.ptr, QVar39.m_size = uVar14,
                       QVar54.m_data = (storage_type_conflict *)uVar13, QVar54.m_size = uVar14,
                       cVar17 = QtPrivate::equalStrings(QVar39,QVar54), cVar17 == '\0')) {
                      args = args + 1;
                      goto LAB_0027a0f0;
                    }
                  }
LAB_0027a164:
                  if (args != pQVar6 + qVar7) {
                    QtPrivate::QMovableArrayOps<QIconDirInfo>::emplace<QIconDirInfo_const&>
                              ((QMovableArrayOps<QIconDirInfo> *)&local_158,local_158.size,args);
                    QList<QIconDirInfo>::end((QList<QIconDirInfo> *)&local_158);
                  }
                }
LAB_0027a19b:
                if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                  }
                }
                ppcVar27 = ppcVar27 + 1;
              } while (ppcVar27 != ppcVar1);
            }
            QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_c8);
          }
          if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,8,0x10);
            }
          }
        }
        local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d = (Data *)(local_130.ptr + uVar28);
        local_c8.ptr = (QIconDirInfo *)CONCAT62(local_c8.ptr._2_6_,0x2f);
        QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                  ((QString *)&local_178,(QStringBuilder<const_QString_&,_char16_t> *)&local_c8);
        if ((char *)local_158.size != (char *)0x0) {
          lVar29 = 0;
          pcVar24 = (char *)0x0;
          pcVar30 = (char *)local_158.size;
          do {
            pQVar6 = local_158.ptr;
            if ((uVar3 <= uVar2) || (1 < (byte)((&(local_158.ptr)->context)[lVar29] - Applications))
               ) {
              pQVar11 = (QString *)((long)&((local_158.ptr)->path).d.d + lVar29);
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
              local_e8._0_8_ = &local_178;
              local_e8._16_2_ = L'/';
              local_e8._8_8_ = pQVar11;
              QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t>::
              convertTo<QString>((QString *)&local_c8,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t>
                                  *)local_e8);
              local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_198.d.ptr = (char16_t *)&local_108;
              local_198.d.d = (Data *)&local_c8;
              QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                        ((QString *)local_e8,
                         (QStringBuilder<const_QString_&,_const_QString_&> *)&local_198);
              cVar17 = QFile::exists((QString *)local_e8);
              if (cVar17 == '\0') {
                if (this->m_supportsSvg == true) {
                  local_198.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_198.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_198.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1a8.a = (QString *)&local_c8;
                  local_1a8.b = (QString *)&local_a8;
                  QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                            (&local_198,&local_1a8);
                  cVar17 = QFile::exists((QString *)&local_198);
                  if (cVar17 != '\0') {
                    pQVar20 = (QArrayDataPointer<QIconDirInfo> *)operator_new(0x50);
                    pQVar20[2].size = 0;
                    pQVar20[3].d = (Data *)0x0;
                    pQVar20->d = (Data *)0x0;
                    pQVar20->ptr = (QIconDirInfo *)0x0;
                    pQVar20->size = 0;
                    pQVar20[1].d = (Data *)0x0;
                    pQVar20[1].ptr = (QIconDirInfo *)0x0;
                    pQVar20[1].size = 0;
                    pQVar20[2].d = (Data *)0x0;
                    pQVar20[2].ptr = (QIconDirInfo *)0x0;
                    *(undefined2 *)&pQVar20[2].size = 1;
                    *(undefined1 *)((long)&pQVar20[2].size + 2) = 2;
                    pQVar20->d = (Data *)&PTR__ScalableEntry_007d1e50;
                    QIcon::QIcon((QIcon *)(pQVar20 + 3));
                    QString::operator=((QString *)&pQVar20[1].ptr,(QString *)pQVar11);
                    pQVar20[2].ptr = *(QIconDirInfo **)((long)&pQVar6->size + lVar29);
                    *(undefined4 *)&pQVar20[2].size = *(undefined4 *)((long)&pQVar6->scale + lVar29)
                    ;
                    QString::operator=((QString *)&pQVar20->ptr,(QString *)&local_198);
                    local_1a8.a = (QString *)pQVar20;
                    std::
                    vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                    ::
                    emplace_back<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>
                              ((vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                                *)__return_storage_ptr__,
                               (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                                *)&local_1a8);
                    if ((QArrayDataPointer<QIconDirInfo> *)local_1a8.a !=
                        (QArrayDataPointer<QIconDirInfo> *)0x0) {
                      (*(code *)((*(Data **)&(local_1a8.a)->d)->super_QArrayData).alloc)();
                    }
                  }
                  if ((QArrayDataPointer<QIconDirInfo> *)local_198.d.d !=
                      (QArrayDataPointer<QIconDirInfo> *)0x0) {
                    LOCK();
                    *(int *)&(local_198.d.d)->super_QArrayData =
                         *(int *)&(local_198.d.d)->super_QArrayData + -1;
                    UNLOCK();
                    if (*(int *)&(local_198.d.d)->super_QArrayData == 0) {
                      QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
              }
              else {
                pQVar20 = (QArrayDataPointer<QIconDirInfo> *)operator_new(0x60);
                pQVar20[2].size = 0;
                ((DataPointer *)&pQVar20[3].d)->d = (Data *)0x0;
                ((DataPointer *)&pQVar20->d)->d = (Data *)0x0;
                pQVar20->ptr = (QIconDirInfo *)0x0;
                pQVar20->size = 0;
                ((DataPointer *)&pQVar20[1].d)->d = (Data *)0x0;
                pQVar20[1].ptr = (QIconDirInfo *)0x0;
                pQVar20[1].size = 0;
                ((DataPointer *)&pQVar20[2].d)->d = (Data *)0x0;
                pQVar20[2].ptr = (QIconDirInfo *)0x0;
                pQVar20[3].ptr = (QIconDirInfo *)0x0;
                pQVar20[3].size = 0;
                *(undefined2 *)&pQVar20[2].size = 1;
                *(undefined1 *)((long)&pQVar20[2].size + 2) = 2;
                ((DataPointer *)&pQVar20->d)->d = (Data *)&PTR__PixmapEntry_007d1e10;
                QPixmap::QPixmap((QPixmap *)(pQVar20 + 3));
                QString::operator=((QString *)&pQVar20[1].ptr,(QString *)pQVar11);
                pQVar20[2].ptr = *(QIconDirInfo **)((long)&pQVar6->size + lVar29);
                *(undefined4 *)&pQVar20[2].size = *(undefined4 *)((long)&pQVar6->scale + lVar29);
                QString::operator=((QString *)&pQVar20->ptr,(QString *)local_e8);
                local_198.d.d = (Data *)pQVar20;
                std::
                vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                ::_M_insert_rval(&__return_storage_ptr__->entries,
                                 (__return_storage_ptr__->entries).
                                 super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_198)
                ;
                if ((QArrayDataPointer<QIconDirInfo> *)local_198.d.d !=
                    (QArrayDataPointer<QIconDirInfo> *)0x0) {
                  (*(code *)(((DataPointer *)&(local_198.d.d)->super_QArrayData)->d->
                            super_QArrayData).alloc)();
                }
              }
              if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                }
              }
              pcVar30 = (char *)local_158.size;
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                  pcVar30 = (char *)local_158.size;
                }
              }
            }
            pcVar24 = pcVar24 + 1;
            lVar29 = lVar29 + 0x28;
          } while (pcVar24 < pcVar30);
        }
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
        QSharedPointer<QIconCacheGtkReader>::deref(dd);
        QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_158);
        uVar28 = uVar28 + 1;
      } while (uVar28 < (ulong)local_130.size);
    }
    if ((__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      QString::QString((QString *)&local_158,(QChar *)local_140.alloc,local_140._0_8_);
      pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
      pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
      (__return_storage_ptr__->iconName).d.d = (Data *)local_158.d;
      (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_158.ptr;
      pcVar30 = (char *)(__return_storage_ptr__->iconName).d.size;
      (__return_storage_ptr__->iconName).d.size = local_158.size;
      local_158.d = (Data *)pQVar5;
      local_158.ptr = pQVar6;
      local_158.size = (qsizetype)pcVar30;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
    }
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    piVar10 = (int *)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_),2,
                   0x10);
      }
    }
    puVar21 = (__return_storage_ptr__->entries).
              super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar23 = (__return_storage_ptr__->entries).
              super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar21 == puVar23) {
    local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_158.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
    QIconTheme::parents((QStringList *)&local_158,this_00);
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a8.m_contentDirs.d.d._0_4_ = 2;
      local_a8.m_contentDirs.d.d._4_4_ = 0;
      local_a8.m_contentDirs.d.ptr._0_4_ = 0;
      local_a8.m_contentDirs.d.ptr._4_4_ = 0;
      local_a8.m_contentDirs.d.size._0_4_ = 0;
      local_a8.m_contentDirs.d.size._4_4_ = 0;
      local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
      QMessageLogger::debug();
      pDVar12 = local_c8.d;
      QVar42.m_data = (storage_type *)0x25;
      QVar42.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar42);
      QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
         ) {
        QTextStream::operator<<((QTextStream *)local_c8.d,' ');
      }
      pDVar12 = local_c8.d;
      QVar43.m_data = (storage_type *)0x14;
      QVar43.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar43);
      QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
         ) {
        QTextStream::operator<<((QTextStream *)local_c8.d,' ');
      }
      *(int *)&local_c8.d[2].super_QArrayData.alloc = (int)local_c8.d[2].super_QArrayData.alloc + 1;
      local_1c0.stream = (Stream *)0x0;
      local_108.d = local_c8.d;
      QtPrivate::printSequentialContainer<QList<QString>>
                ((QtPrivate *)&local_178,(Stream *)&local_108,"QList",(QList<QString> *)&local_158);
      QDebug::~QDebug((QDebug *)&local_108);
      this_02 = local_178.d.d;
      QVar44.m_data = &DAT_00000010;
      QVar44.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar44);
      QTextStream::operator<<((QTextStream *)this_02,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_178.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_178.d.d,' ');
      }
      *(int *)&local_178.d.d[2].super_QArrayData.alloc =
           (int)local_178.d.d[2].super_QArrayData.alloc + 1;
      local_1b8.stream = (Stream *)0x0;
      local_108.d = (Data *)local_178.d.d;
      QtPrivate::printSequentialContainer<QList<QString>>
                (local_1b0,(Stream *)&local_108,"QList",visited);
      QDebug::~QDebug((QDebug *)&local_108);
      QDebug::~QDebug((QDebug *)local_1b0);
      QDebug::~QDebug(&local_1b8);
      QDebug::~QDebug((QDebug *)&local_178);
      QDebug::~QDebug(&local_1c0);
      QDebug::~QDebug((QDebug *)&local_c8);
    }
    if ((char *)local_158.size != (char *)0x0) {
      pcVar30 = (char *)0x0;
      do {
        local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        QString::trimmed_helper((QString *)&local_178);
        QVar49.m_data = (storage_type_conflict *)local_178.d.ptr;
        QVar49.m_size = local_178.d.size;
        cVar17 = QtPrivate::QStringList_contains((QList_conflict *)visited,QVar49,CaseSensitive);
        if (cVar17 == '\0') {
          findIconHelper((QThemeIconInfo *)&local_a8,this,(QString *)&local_178,iconName,visited,
                         NoFallBack);
          local_108.size =
               (qsizetype)
               (__return_storage_ptr__->entries).
               super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.size._4_4_,
                                 (undefined4)local_a8.m_contentDirs.d.size);
          local_108.d = (Data *)(__return_storage_ptr__->entries).
                                super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
          local_108.ptr =
               (QIconDirInfo *)
               (__return_storage_ptr__->entries).
               super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,
                                 local_a8.m_contentDirs.d.ptr._0_4_);
          local_a8.m_contentDirs.d.d._0_4_ = 0;
          local_a8.m_contentDirs.d.d._4_4_ = 0;
          local_a8.m_contentDirs.d.ptr._0_4_ = 0;
          local_a8.m_contentDirs.d.ptr._4_4_ = 0;
          local_a8.m_contentDirs.d.size._0_4_ = 0;
          local_a8.m_contentDirs.d.size._4_4_ = 0;
          std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                     *)&local_108);
          pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
          pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
          (__return_storage_ptr__->iconName).d.d = (Data *)local_a8.m_keyList.d.d;
          (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_a8.m_keyList.d.ptr;
          qVar7 = (__return_storage_ptr__->iconName).d.size;
          (__return_storage_ptr__->iconName).d.size = local_a8.m_keyList.d.size;
          local_a8.m_keyList.d.d = (Data *)pQVar5;
          local_a8.m_keyList.d.ptr = pQVar6;
          local_a8.m_keyList.d.size = qVar7;
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
          std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                     *)&local_a8);
        }
        puVar21 = (__return_storage_ptr__->entries).
                  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar23 = (__return_storage_ptr__->entries).
                  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
      } while ((puVar21 == puVar23) && (pcVar30 = pcVar30 + 1, pcVar30 < (ulong)local_158.size));
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_158);
  }
  if (((rule == FallBack) &&
      ((__return_storage_ptr__->entries).
       super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->entries).
       super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (QVar8.m_data = (storage_type_conflict *)local_140.alloc,
     QVar8.m_size._0_4_ = local_140.ref_._q_value.super___atomic_base<int>._M_i,
     QVar8.m_size._4_4_ =
          local_140.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
          super_QFlagsStorage<QArrayData::ArrayOption>.i,
     iVar18 = QtPrivate::lastIndexOf(QVar8,-1,L'-',CaseSensitive), iVar18 != -1)) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a8.m_contentDirs.d.d._0_4_ = 2;
      local_a8.m_contentDirs.d.d._4_4_ = 0;
      local_a8.m_contentDirs.d.ptr._0_4_ = 0;
      local_a8.m_contentDirs.d.ptr._4_4_ = 0;
      local_a8.m_contentDirs.d.size._0_4_ = 0;
      local_a8.m_contentDirs.d.size._4_4_ = 0;
      local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
      QMessageLogger::debug();
      pDVar12 = local_158.d;
      QVar45.m_data = (storage_type *)0x2a;
      QVar45.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar45);
      QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_158.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_158.d,' ');
      }
      pDVar12 = local_158.d;
      QVar46.m_data = (storage_type *)0x14;
      QVar46.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar46);
      QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_158.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_158.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_158);
    }
    local_140._0_8_ = SEXT48(iVar18);
    local_158.size = 0;
    local_158.d = (Data *)0x0;
    local_158.ptr = (QIconDirInfo *)0x0;
    QString::QString((QString *)&local_178,(QChar *)local_140.alloc,local_140._0_8_);
    findIconHelper((QThemeIconInfo *)&local_a8,this,themeName,(QString *)&local_178,
                   (QStringList *)&local_158,FallBack);
    local_108.size =
         (qsizetype)
         (__return_storage_ptr__->entries).
         super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.size._4_4_,
                           (undefined4)local_a8.m_contentDirs.d.size);
    local_108.d = (Data *)(__return_storage_ptr__->entries).
                          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    local_108.ptr =
         (QIconDirInfo *)
         (__return_storage_ptr__->entries).
         super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_);
    local_a8.m_contentDirs.d.d._0_4_ = 0;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    std::
    vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               *)&local_108);
    pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
    pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
    (__return_storage_ptr__->iconName).d.d = (Data *)local_a8.m_keyList.d.d;
    (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_a8.m_keyList.d.ptr;
    qVar7 = (__return_storage_ptr__->iconName).d.size;
    (__return_storage_ptr__->iconName).d.size = local_a8.m_keyList.d.size;
    local_a8.m_keyList.d.d = (Data *)pQVar5;
    local_a8.m_keyList.d.ptr = pQVar6;
    local_a8.m_keyList.d.size = qVar7;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    std::
    vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               *)&local_a8);
    if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_158);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
LAB_0027adf3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QThemeIconInfo QIconLoader::findIconHelper(const QString &themeName,
                                           const QString &iconName,
                                           QStringList &visited,
                                           DashRule rule) const
{
    qCDebug(lcIconLoader) << "Finding icon" << iconName << "in theme" << themeName
                          << "skipping" << visited;

    QThemeIconInfo info;
    Q_ASSERT(!themeName.isEmpty());

    // Used to protect against potential recursions
    visited << themeName;

    QIconTheme &theme = themeList[themeName];
    if (!theme.isValid()) {
        theme = QIconTheme(themeName);
        if (!theme.isValid()) {
            qCDebug(lcIconLoader) << "Theme" << themeName << "not found";
            return info;
        }
    }

    const QStringList contentDirs = theme.contentDirs();

    QStringView iconNameFallback(iconName);
    bool searchingGenericFallback = m_iconName.length() > iconName.length();

    // Iterate through all icon's fallbacks in current theme
    if (info.entries.empty()) {
        const QString svgIconName = iconNameFallback + ".svg"_L1;
        const QString pngIconName = iconNameFallback + ".png"_L1;

        // Add all relevant files
        for (int i = 0; i < contentDirs.size(); ++i) {
            QList<QIconDirInfo> subDirs = theme.keyList();

            // Try to reduce the amount of subDirs by looking in the GTK+ cache in order to save
            // a massive amount of file stat (especially if the icon is not there)
            auto cache = theme.m_gtkCaches.at(i);
            if (cache->isValid()) {
                const auto result = cache->lookup(iconNameFallback);
                if (cache->isValid()) {
                    const QList<QIconDirInfo> subDirsCopy = subDirs;
                    subDirs.clear();
                    subDirs.reserve(result.size());
                    for (const char *s : result) {
                        QString path = QString::fromUtf8(s);
                        auto it = std::find_if(subDirsCopy.cbegin(), subDirsCopy.cend(),
                                               [&](const QIconDirInfo &info) {
                                                   return info.path == path; } );
                        if (it != subDirsCopy.cend()) {
                            subDirs.append(*it);
                        }
                    }
                }
            }

            QString contentDir = contentDirs.at(i) + u'/';
            for (int j = 0; j < subDirs.size() ; ++j) {
                const QIconDirInfo &dirInfo = subDirs.at(j);
                if (searchingGenericFallback &&
                        (dirInfo.context == QIconDirInfo::Applications ||
                         dirInfo.context == QIconDirInfo::MimeTypes))
                    continue;

                const QString subDir = contentDir + dirInfo.path + u'/';
                const QString pngPath = subDir + pngIconName;
                if (QFile::exists(pngPath)) {
                    auto iconEntry = std::make_unique<PixmapEntry>();
                    iconEntry->dir = dirInfo;
                    iconEntry->filename = pngPath;
                    // Notice we ensure that pixmap entries always come before
                    // scalable to preserve search order afterwards
                    info.entries.insert(info.entries.begin(), std::move(iconEntry));
                } else if (m_supportsSvg) {
                    const QString svgPath = subDir + svgIconName;
                    if (QFile::exists(svgPath)) {
                        auto iconEntry = std::make_unique<ScalableEntry>();
                        iconEntry->dir = dirInfo;
                        iconEntry->filename = svgPath;
                        info.entries.push_back(std::move(iconEntry));
                    }
                }
            }
        }

        if (!info.entries.empty()) {
            info.iconName = iconNameFallback.toString();
        }
    }

    if (info.entries.empty()) {
        const QStringList parents = theme.parents();
        qCDebug(lcIconLoader) << "Did not find matching icons in theme;"
            << "trying parent themes" << parents
            << "skipping visited" << visited;

        // Search recursively through inherited themes
        for (int i = 0 ; i < parents.size() ; ++i) {

            const QString parentTheme = parents.at(i).trimmed();

            if (!visited.contains(parentTheme)) // guard against recursion
                info = findIconHelper(parentTheme, iconName, visited, QIconLoader::NoFallBack);

            if (!info.entries.empty()) // success
                break;
        }
    }

    if (rule == QIconLoader::FallBack && info.entries.empty()) {
        // If it's possible - find next fallback for the icon
        const int indexOfDash = iconNameFallback.lastIndexOf(u'-');
        if (indexOfDash != -1) {
            qCDebug(lcIconLoader) << "Did not find matching icons in all themes;"
                                  << "trying dash fallback";
            iconNameFallback.truncate(indexOfDash);
            QStringList _visited;
            info = findIconHelper(themeName, iconNameFallback.toString(), _visited, QIconLoader::FallBack);
        }
    }

    return info;
}